

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
try_first(iterator *this)

{
  atomic<long> *paVar1;
  long lVar2;
  olc_node_ptr node;
  bool bVar3;
  undefined1 local_28 [8];
  read_critical_section parent_critical_section;
  
  invalidate(this);
  optimistic_lock::try_read_lock((optimistic_lock *)local_28);
  if (local_28 == (undefined1  [8])0x0) {
    bVar3 = false;
  }
  else {
    node.tagged_ptr = (this->db_->root).value._M_i.tagged_ptr;
    if (node.tagged_ptr == 0) {
      if ((((atomic<long> *)((long)local_28 + 8))->super___atomic_base<long>)._M_i < 1) {
        __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                      ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
      }
      bVar3 = parent_critical_section.lock == *(optimistic_lock **)local_28;
      if (bVar3) {
        LOCK();
        paVar1 = (atomic<long> *)((long)local_28 + 8);
        lVar2 = (paVar1->super___atomic_base<long>)._M_i;
        (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
        UNLOCK();
        if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
          __assert_fail("old_value > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                        ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
        }
      }
      else {
        optimistic_lock::dec_read_lock_count((optimistic_lock *)local_28);
      }
      local_28 = (undefined1  [8])0x0;
    }
    else {
      bVar3 = try_left_most_traversal(this,node,(read_critical_section *)local_28);
    }
  }
  optimistic_lock::read_critical_section::~read_critical_section((read_critical_section *)local_28);
  return bVar3;
}

Assistant:

bool olc_db<Key, Value>::iterator::try_first() {
  invalidate();  // clear the stack
  auto parent_critical_section = db_.root_pointer_lock.try_read_lock();
  if (UNODB_DETAIL_UNLIKELY(parent_critical_section.must_restart()))
    return false;  // LCOV_EXCL_LINE
  auto node{db_.root.load()};
  if (UNODB_DETAIL_UNLIKELY(node == nullptr)) {
    return UNODB_DETAIL_LIKELY(parent_critical_section.try_read_unlock());
  }
  return try_left_most_traversal(node, parent_critical_section);
}